

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  undefined8 node;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  char (*node_00) [4];
  PromiseArena *pPVar6;
  WeakFulfiller<unsigned_int> *pWVar7;
  void *pvVar8;
  TransformPromiseNodeBase *pTVar9;
  OwnPromiseNode intermediate_1;
  char receiveBuffer [4];
  OwnPromiseNode intermediate;
  PromiseFulfillerPair<unsigned_int> port;
  Own<kj::AsyncIoStream,_std::nullptr_t> client;
  Own<kj::AsyncIoStream,_std::nullptr_t> server;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  String result;
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  AsyncIoContext ioContext;
  OwnPromiseNode local_138;
  OwnPromiseNode local_130;
  OwnPromiseNode local_128;
  undefined4 local_11c;
  OwnPromiseNode local_118;
  OwnPromiseNode local_110;
  OwnPromiseNode local_108;
  undefined1 local_100 [16];
  WeakFulfiller<unsigned_int> *local_f0;
  undefined1 local_e8 [8];
  long *plStack_e0;
  PromiseNode local_d8;
  _func_int *local_c8;
  long *plStack_c0;
  String local_b8;
  DebugComparison<const_char_(&)[4],_kj::String_&> local_a0;
  undefined8 *local_78;
  long *local_70;
  undefined8 *local_68;
  long *local_60;
  char *local_48;
  char *pcStack_40;
  byte local_38 [8];
  
  setupAsyncIo();
  pPVar6 = (PromiseArena *)(**(code **)(*local_60 + 0x18))();
  local_c8 = (_func_int *)0x0;
  plStack_c0 = (long *)0x0;
  local_d8.super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)0x0;
  local_d8.super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  local_e8 = (undefined1  [8])0x0;
  plStack_e0 = (long *)0x0;
  local_11c = 0;
  pWVar7 = (WeakFulfiller<unsigned_int> *)operator_new(0x18);
  (pWVar7->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00608418;
  (pWVar7->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00608450;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<unsigned_int>&>
            ((PromiseDisposer *)&local_a0,pWVar7);
  local_100._0_8_ = local_a0.left;
  pPVar1 = *(PromiseArena **)((long)local_a0.left + 8);
  local_100._8_8_ = &pWVar7->super_WeakFulfillerBase;
  local_f0 = pWVar7;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_a0.left - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)local_100,
               kj::_::
               SimpleTransformPromiseNode<unsigned_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:68:21)>
               ::anon_class_8_1_f13b8d0e_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060cc08;
    *(PromiseArena **)((long)pvVar8 + 0x3f8) = pPVar6;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    *(PromiseArena **)((long)local_a0.left + 8) = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)
             &((PromiseArenaMember *)((long)local_a0.left + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)local_100,
               kj::_::
               SimpleTransformPromiseNode<unsigned_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:68:21)>
               ::anon_class_8_1_f13b8d0e_for_func::operator());
    ((PromiseArenaMember *)((long)local_a0.left + -0x30))->arena =
         (PromiseArena *)&PTR_destroy_0060cc08;
    ((PromiseArenaMember *)((long)local_a0.left + -0x10))->arena = pPVar6;
    ((PromiseArenaMember *)((long)local_a0.left + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_118.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_b8,&local_118,(SourceLocation *)&local_a0);
  OVar2.ptr = local_118.ptr;
  local_138.ptr = (PromiseNode *)local_b8.content.ptr;
  if ((TransformPromiseNodeBase *)local_118.ptr != (TransformPromiseNodeBase *)0x0) {
    local_118.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_138.ptr;
  pPVar1 = ((local_138.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_138.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_138,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:70:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060cc60;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_138.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)&local_138.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_138,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:70:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060cc60;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_118.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_b8,&local_118,(SourceLocation *)&local_a0);
  OVar2.ptr = local_118.ptr;
  local_130.ptr = (PromiseNode *)local_b8.content.ptr;
  if ((TransformPromiseNodeBase *)local_118.ptr != (TransformPromiseNodeBase *)0x0) {
    local_118.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_130.ptr;
  pPVar1 = ((local_130.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_130.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_130,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:72:11)>
               ::anon_class_8_1_5036e509_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060ccb8;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_e8;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_130.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)&local_130.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_130,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:72:11)>
               ::anon_class_8_1_5036e509_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060ccb8;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_e8;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_118.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_b8,&local_118,(SourceLocation *)&local_a0);
  OVar2.ptr = local_118.ptr;
  local_128.ptr = (PromiseNode *)local_b8.content.ptr;
  if ((TransformPromiseNodeBase *)local_118.ptr != (TransformPromiseNodeBase *)0x0) {
    local_118.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_128.ptr;
  pPVar1 = ((local_128.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_128.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_128,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:75:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060cd10;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_128.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)&local_128.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_128,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:75:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060cd10;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_a0.left = (char (*) [4])pTVar9;
  kj::_::detach((Promise<void> *)&local_a0);
  node_00 = local_a0.left;
  if ((TransformPromiseNodeBase *)local_a0.left != (TransformPromiseNodeBase *)0x0) {
    local_a0.left = (char (*) [4])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
  }
  OVar2.ptr = local_128.ptr;
  if (&(local_128.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_128.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_130.ptr;
  if (&(local_130.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_130.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_138.ptr;
  if (&(local_138.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_138.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  (*(code *)**(undefined8 **)pPVar6->bytes)(&local_110,pPVar6,"*",2,0);
  OVar2.ptr = local_110.ptr;
  pPVar1 = ((local_110.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_110.ptr - (long)pPVar1) < 0x30) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_110,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:79:54)>
               ::anon_class_16_2_642b6666_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_0060cd68;
    *(_func_int ***)((long)pvVar8 + 0x3f0) = &local_c8;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_100;
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    ((local_110.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)(local_110.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_110,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:79:54)>
               ::anon_class_16_2_642b6666_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060cd68;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = &local_c8;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_100;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_128.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_118,&local_128,(SourceLocation *)&local_a0);
  OVar2.ptr = local_128.ptr;
  local_108.ptr = local_118.ptr;
  if ((TransformPromiseNodeBase *)local_128.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_108.ptr;
  pPVar1 = ((local_108.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_108.ptr - (long)pPVar1) < 0x30) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_108,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:83:11)>
               ::anon_class_16_2_f6449cab_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_0060cdc0;
    *(PromiseNode **)((long)pvVar8 + 0x3f0) = &local_d8;
    *(undefined4 **)((long)pvVar8 + 0x3f8) = &local_11c;
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    ((local_108.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)(local_108.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_108,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:83:11)>
               ::anon_class_16_2_f6449cab_for_func::operator());
    ((OwnPromiseNode *)(OVar2.ptr + -3))->ptr = (PromiseNode *)&PTR_destroy_0060cdc0;
    ((OwnPromiseNode *)(OVar2.ptr + -1))->ptr = &local_d8;
    ((OwnPromiseNode *)(OVar2.ptr + -1))[1] = (OwnPromiseNode)&local_11c;
    ((OwnPromiseNode *)(OVar2.ptr + -3))[1] = (OwnPromiseNode)pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_128.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_118,&local_128,(SourceLocation *)&local_a0);
  OVar2.ptr = local_128.ptr;
  local_138.ptr = local_118.ptr;
  if ((TransformPromiseNodeBase *)local_128.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_138.ptr;
  pPVar1 = ((local_138.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_138.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_138,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:86:11)>
               ::anon_class_8_1_2dcb5b23_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060ce18;
    *(undefined4 **)((long)pvVar8 + 0x3f8) = &local_11c;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_138.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)((OwnPromiseNode *)(local_138.ptr + -3) + 1);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_138,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:86:11)>
               ::anon_class_8_1_2dcb5b23_for_func::operator());
    ((OwnPromiseNode *)(OVar2.ptr + -3))[1] = (OwnPromiseNode)&PTR_destroy_0060ce18;
    ((OwnPromiseNode *)(OVar2.ptr + -1))[1] = (OwnPromiseNode)&local_11c;
    (((TransformPromiseNodeBase *)(OVar2.ptr + -2))->super_PromiseNode).super_PromiseArenaMember.
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_40 = "run";
  local_38[0] = 'O';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\x17';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_130.ptr = &pTVar9->super_PromiseNode;
  Promise<kj::String>::wait((Promise<kj::String> *)&local_b8,&local_130);
  OVar2.ptr = local_130.ptr;
  if ((TransformPromiseNodeBase *)local_130.ptr != (TransformPromiseNodeBase *)0x0) {
    local_130.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_138.ptr;
  if ((TransformPromiseNodeBase *)local_138.ptr != (TransformPromiseNodeBase *)0x0) {
    local_138.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_108.ptr;
  if ((TransformPromiseNodeBase *)local_108.ptr != (TransformPromiseNodeBase *)0x0) {
    local_108.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_110.ptr;
  if (&(local_110.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_110.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  local_118.ptr = (PromiseNode *)0x4d8ac4;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_a0,(DebugExpression<char_const(&)[4]> *)&local_118,&local_b8);
  if ((local_a0.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x5b,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",&local_a0,
               (char (*) [4])0x4d8ac4,&local_b8);
  }
  sVar5 = local_b8.content.size_;
  pcVar4 = local_b8.content.ptr;
  if ((PromiseArenaMember *)local_b8.content.ptr != (PromiseArenaMember *)0x0) {
    local_b8.content.ptr = (char *)0x0;
    local_b8.content.size_ = 0;
    (**(local_b8.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.content.disposer,pcVar4,1,sVar5,sVar5,0);
  }
  pWVar7 = local_f0;
  if (local_f0 != (WeakFulfiller<unsigned_int> *)0x0) {
    local_f0 = (WeakFulfiller<unsigned_int> *)0x0;
    (**((Disposer *)local_100._8_8_)->_vptr_Disposer)
              (local_100._8_8_,
               (pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector.
               _vptr_PromiseRejector[-2] +
               (long)&(pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector.
                      _vptr_PromiseRejector);
  }
  node = local_100._0_8_;
  if ((PromiseArenaMember *)local_100._0_8_ != (PromiseArenaMember *)0x0) {
    local_100._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  plVar3 = plStack_e0;
  if (plStack_e0 != (long *)0x0) {
    plStack_e0 = (long *)0x0;
    (*(code *)**(undefined8 **)local_e8)(local_e8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pPVar1 = local_d8.super_PromiseArenaMember.arena;
  if (local_d8.super_PromiseArenaMember.arena != (PromiseArena *)0x0) {
    local_d8.super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    (**(code **)*local_d8.super_PromiseArenaMember._vptr_PromiseArenaMember)
              (local_d8.super_PromiseArenaMember._vptr_PromiseArenaMember,
               pPVar1->bytes + *(long *)(*(long *)pPVar1->bytes + -0x10));
  }
  plVar3 = plStack_c0;
  if (plStack_c0 != (long *)0x0) {
    plStack_c0 = (long *)0x0;
    (*(code *)**(undefined8 **)local_c8)(local_c8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_60;
  if (local_60 != (long *)0x0) {
    local_60 = (long *)0x0;
    (**(code **)*local_68)(local_68,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_70;
  if (local_70 != (long *)0x0) {
    local_70 = (long *)0x0;
    (**(code **)*local_78)(local_78,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, SimpleNetwork) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4]{};

  auto port = newPromiseAndFulfiller<uint>();

  port.promise.then([&](uint portnum) {
    return network.parseAddress("localhost", portnum);
  }).then([&](Own<NetworkAddress>&& result) {
    return result->connect();
  }).then([&](Own<AsyncIoStream>&& result) {
    client = kj::mv(result);
    return client->write("foo"_kjb);
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = network.parseAddress("*").then([&](Own<NetworkAddress>&& result) {
    listener = result->listen();
    port.fulfiller->fulfill(listener->getPort());
    return listener->accept();
  }).then([&](Own<AsyncIoStream>&& result) {
    server = kj::mv(result);
    return server->tryRead(receiveBuffer, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}